

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_VisibilityFeatureSetStrict_Test::
FeaturesTest_VisibilityFeatureSetStrict_Test(FeaturesTest_VisibilityFeatureSetStrict_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::DescriptorPool(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_0187e208;
  return;
}

Assistant:

TEST_F(FeaturesTest, VisibilityFeatureSetStrict) {
  BuildDescriptorMessagesInTestPool();

  ASSERT_THAT(ParseAndBuildFile("vis.proto", R"schema(
    edition = "2024";
    package naming;

    option features.default_symbol_visibility = STRICT;

    local message LocalOuter {
      local enum Inner {
        VAL_1 = 0;
      }
    }

    export message ExportOuter {
      enum Inner {
        VAL_1 = 0;
      }
    }
  )schema"),
              NotNull());
}